

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *pGVar6;
  FILE *pFVar7;
  Gia_Man_t *pGVar8;
  int *piVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  Acec_ParCec_t ParsCec;
  Gia_Man_t *pGia0;
  Gia_Man_t *pGia1;
  Acec_ParCec_t local_80;
  Gia_Man_t *local_58 [3];
  char *local_40;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Acec_ManCecSetDefaultParams(&local_80);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"CTmdtbvh"), pAbc_00 = local_38,
          iVar3 = globalUtilOptind, 99 < iVar1) {
      if (iVar1 < 0x74) {
        piVar9 = &local_80.fDualOutput;
        if ((iVar1 != 100) && (piVar9 = &local_80.fMiter, iVar1 != 0x6d)) goto LAB_0028e961;
      }
      else {
        piVar9 = &local_80.fTwoOutput;
        if (iVar1 != 0x74) {
          if (iVar1 != 0x76) goto LAB_0028e961;
          piVar9 = &local_80.fVerbose;
        }
      }
LAB_0028e863:
      *(byte *)piVar9 = (byte)*piVar9 ^ 1;
    }
    if (iVar1 < 0x54) {
      if (iVar1 != 0x43) {
        if (iVar1 == -1) {
          if (local_80.fMiter == 0) {
            lVar4 = (long)globalUtilOptind;
            if ((uint)(argc - globalUtilOptind) < 2) {
              if (argc != globalUtilOptind) {
                pcVar10 = argv[lVar4];
                pcVar11 = pcVar10;
                break;
              }
              pcVar10 = local_38->pGia->pSpec;
              if (pcVar10 != (char *)0x0) goto LAB_0028ec58;
              bVar12 = false;
              Abc_Print(-1,"File name is not given on the command line.\n");
              argc = 1;
              goto joined_r0x0028ed9d;
            }
            if (argc - globalUtilOptind == 2) {
              local_58[0] = (Gia_Man_t *)0x0;
              local_58[1] = (Gia_Man_t *)0x0;
              local_58[2] = (Gia_Man_t *)argv[lVar4];
              local_40 = argv[lVar4 + 1];
              bVar12 = false;
              lVar4 = 0;
              goto LAB_0028eb58;
            }
            pcVar10 = "Too many command-line arguments.\n";
          }
          else if (globalUtilOptind == argc) {
            pGVar8 = local_38->pGia;
            if (pGVar8 != (Gia_Man_t *)0x0) {
              if (local_80.fDualOutput == 0) {
                if (local_80.fTwoOutput == 0) {
                  if (local_80.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)local_80.nBTLimit);
                  }
                  pGVar8 = Gia_ManDemiterToDual(pAbc_00->pGia);
                  Gia_ManDemiterDual(pGVar8,local_58,local_58 + 2);
                  Gia_ManStop(pGVar8);
                }
                else {
                  if ((pGVar8->vCos->nSize - pGVar8->nRegs & 1U) != 0) {
                    pcVar10 = "The two-output miter should have an even number of outputs.\n";
                    goto LAB_0028eec6;
                  }
                  if (local_80.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)local_80.nBTLimit);
                  }
                  Gia_ManDemiterTwoWords(pAbc_00->pGia,local_58,local_58 + 2);
                }
              }
              else {
                if ((pGVar8->vCos->nSize - pGVar8->nRegs & 1U) != 0) {
                  pcVar10 = "The dual-output miter should have an even number of outputs.\n";
                  goto LAB_0028eec6;
                }
                if (local_80.fSilent == 0) {
                  Abc_Print(1,
                            "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                            ,(ulong)(uint)local_80.nBTLimit);
                }
                Gia_ManDemiterDual(pAbc_00->pGia,local_58,local_58 + 2);
              }
              iVar3 = Acec_Solve(local_58[0],local_58[2],&local_80);
              pAbc_00->Status = iVar3;
              Abc_FrameReplaceCex(pAbc_00,&local_58[0]->pCexComb);
              Gia_ManStop(local_58[0]);
              Gia_ManStop(local_58[2]);
              goto LAB_0028eeb8;
            }
            pcVar10 = "Abc_CommandAbc9Acec(): There is no AIG.\n";
          }
          else {
            pcVar10 = 
            "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n"
            ;
          }
LAB_0028eec6:
          iVar3 = -1;
          goto LAB_0028ea9b;
        }
        goto LAB_0028e961;
      }
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0028e955;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_80.nBTLimit = uVar2;
    }
    else {
      if (iVar1 != 0x54) {
        piVar9 = &local_80.fBooth;
        if (iVar1 == 0x62) goto LAB_0028e863;
        goto LAB_0028e961;
      }
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_0028e955:
        Abc_Print(-1,pcVar10);
        goto LAB_0028e961;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_80.TimeLimit = uVar2;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0028e961:
      Abc_Print(-2,"usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_80.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_80.TimeLimit);
      pcVar10 = "miter";
      if (local_80.fMiter == 0) {
        pcVar10 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar10);
      pcVar11 = "yes";
      pcVar10 = "yes";
      if (local_80.fDualOutput == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar10);
      pcVar10 = "yes";
      if (local_80.fTwoOutput == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar10);
      pcVar10 = "yes";
      if (local_80.fBooth == 0) {
        pcVar10 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle working with Booth multipliers [default = %s]\n",pcVar10);
      if (local_80.fVerbose == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar11);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      pcVar10 = "\tfile2  : (optional) the file with the second network\n";
      iVar3 = -2;
LAB_0028ea9b:
      Abc_Print(iVar3,pcVar10);
      return 1;
    }
  } while( true );
LAB_0028ec16:
  if (*pcVar11 == '>') {
    *pcVar11 = '\\';
  }
  else if (*pcVar11 == '\0') goto LAB_0028ec38;
  pcVar11 = pcVar11 + 1;
  goto LAB_0028ec16;
LAB_0028eb58:
  pGVar8 = local_58[lVar4 + 2];
  pGVar5 = pGVar8;
  do {
    if (*(char *)&pGVar5->pName == '>') {
      *(char *)&pGVar5->pName = '\\';
    }
    else if (*(char *)&pGVar5->pName == '\0') break;
    pGVar5 = (Gia_Man_t *)((long)&pGVar5->pName + 1);
  } while( true );
  pFVar7 = fopen((char *)pGVar8,"r");
  if (pFVar7 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pGVar8);
    pGVar8 = (Gia_Man_t *)
             Extra_FileGetSimilarName
                       ((char *)pGVar8,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    local_58[lVar4 + 2] = pGVar8;
    if (pGVar8 != (Gia_Man_t *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pGVar8);
    }
    pcVar10 = "\n";
    argc = 1;
    iVar3 = 1;
  }
  else {
    fclose(pFVar7);
    pGVar6 = Gia_AigerRead((char *)pGVar8,0,0,0);
    local_58[lVar4] = pGVar6;
    pGVar5 = local_58[1];
    pGVar8 = local_58[0];
    if (pGVar6 != (Gia_Man_t *)0x0) {
      bVar12 = lVar4 != 0;
      lVar4 = lVar4 + 1;
      if (bVar12) goto code_r0x0028ebbe;
      goto LAB_0028eb58;
    }
    pcVar10 = "Reading AIGER has failed.\n";
    argc = 0;
    iVar3 = -1;
  }
  Abc_Print(iVar3,pcVar10);
  goto joined_r0x0028ed9d;
code_r0x0028ebbe:
  iVar3 = Acec_Solve(local_58[0],local_58[1],&local_80);
  pAbc_00->Status = iVar3;
  Abc_FrameReplaceCex(pAbc_00,&pGVar8->pCexComb);
  Gia_ManStop(pGVar8);
  Gia_ManStop(pGVar5);
  goto joined_r0x0028ed9d;
LAB_0028ec38:
  pFVar7 = fopen(pcVar10,"r");
  if (pFVar7 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar10);
    pcVar10 = Extra_FileGetSimilarName
                        (pcVar10,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (pcVar10 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar10);
    }
    bVar12 = false;
    argc = 1;
    Abc_Print(1,"\n");
  }
  else {
    fclose(pFVar7);
LAB_0028ec58:
    argc = 0;
    pGVar8 = Gia_AigerRead(pcVar10,0,0,0);
    if (pGVar8 == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Reading AIGER has failed.\n");
      bVar12 = false;
    }
    else {
      iVar3 = Acec_Solve(pAbc_00->pGia,pGVar8,&local_80);
      pAbc_00->Status = iVar3;
      Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
      Gia_ManStop(pGVar8);
      bVar12 = true;
    }
  }
joined_r0x0028ed9d:
  if (bVar12) {
LAB_0028eeb8:
    argc = 0;
  }
  return argc;
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Acec_ParCec_t ParsCec, * pPars = &ParsCec;
    char ** pArgvNew;
    int c, nArgcNew;
    Acec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTmdtbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOutput ^= 1;
            break;
        case 't':
            pPars->fTwoOutput ^= 1;
            break;
        case 'b':
            pPars->fBooth ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( argc != globalUtilOptind )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n" );
            return 1;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( pPars->fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else if ( pPars->fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The two-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else // regular single- or multi-output miter
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 || nArgcNew == 1 )
    {
        Gia_Man_t * pSecond;
        char * pTemp, * FileName = NULL;
        if ( nArgcNew == 0 )
        {
            FileName = pAbc->pGia->pSpec;
            if ( FileName == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
        }
        else // if ( nArgcNew == 1 )
        {
            FileName = pArgvNew[0];
            // fix the wrong symbol
            for ( pTemp = FileName; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName, "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
                if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
        }
        pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pSecond == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
        pAbc->Status = Acec_Solve( pAbc->pGia, pSecond, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pSecond );
    }
    else if ( nArgcNew == 2 )
    {
        Gia_Man_t * pGias[2] = {NULL};  int i;
        char * pTemp, * FileName[2] = { pArgvNew[0], pArgvNew[1] };
        for ( i = 0; i < 2; i++ )
        {
            // fix the wrong symbol
            for ( pTemp = FileName[i]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName[i], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName[i] );
                if ( (FileName[i] = Extra_FileGetSimilarName( FileName[i], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName[i] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[i] = Gia_AigerRead( FileName[i], 0, 0, 0 );
            if ( pGias[i] == NULL )
            {
                Abc_Print( -1, "Reading AIGER has failed.\n" );
                return 0;
            }
        }
        pAbc->Status = Acec_Solve( pGias[0], pGias[1], pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pGias[0] );
        Gia_ManStop( pGias[1] );
    }
    else
    {
        Abc_Print( -1, "Too many command-line arguments.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", pPars->fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", pPars->fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", pPars->fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-b     : toggle working with Booth multipliers [default = %s]\n", pPars->fBooth? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    return 1;
}